

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_bary2(REF_GEOM ref_geom,REF_INT *nodes,REF_DBL t,REF_DBL *bary)

{
  undefined1 auVar1 [16];
  char *pcVar2;
  uint uVar3;
  undefined8 uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  REF_INT sens;
  REF_DBL t1;
  REF_DBL t0;
  REF_DBL local_38;
  
  local_38 = t;
  uVar3 = ref_geom_cell_tuv(ref_geom,*nodes,nodes,1,&t0,&sens);
  if (uVar3 == 0) {
    uVar3 = ref_geom_cell_tuv(ref_geom,nodes[1],nodes,1,&t1,&sens);
    if (uVar3 == 0) {
      auVar6._0_8_ = t1 - local_38;
      auVar6._8_8_ = local_38 - t0;
      *(undefined1 (*) [16])bary = auVar6;
      dVar5 = auVar6._8_8_ + auVar6._0_8_;
      dVar7 = dVar5 * 1e+20;
      if (dVar7 <= -dVar7) {
        dVar7 = -dVar7;
      }
      dVar8 = auVar6._0_8_;
      if (auVar6._0_8_ <= -auVar6._0_8_) {
        dVar8 = -auVar6._0_8_;
      }
      if (dVar8 < dVar7) {
        dVar8 = auVar6._8_8_;
        if (auVar6._8_8_ <= -auVar6._8_8_) {
          dVar8 = -auVar6._8_8_;
        }
        if (dVar8 < dVar7) {
          auVar1._8_8_ = dVar5;
          auVar1._0_8_ = dVar5;
          auVar6 = divpd(auVar6,auVar1);
          *(undefined1 (*) [16])bary = auVar6;
          return 0;
        }
      }
      printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf89,
             "ref_geom_bary2");
      *bary = 0.0;
      bary[1] = 0.0;
      return 4;
    }
    pcVar2 = "cell uv1";
    uVar4 = 0xf7b;
  }
  else {
    pcVar2 = "cell uv0";
    uVar4 = 0xf79;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar4,
         "ref_geom_bary2",(ulong)uVar3,pcVar2 + 5);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bary2(REF_GEOM ref_geom, REF_INT *nodes, REF_DBL t,
                                  REF_DBL *bary) {
  REF_DBL t0, t1;
  REF_INT sens;
  REF_DBL total;
  RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &t0, &sens),
      "uv0");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &t1, &sens),
      "uv1");

  bary[0] = t1 - t;
  bary[1] = t - t0;

  total = bary[0] + bary[1];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total)) {
    bary[0] /= total;
    bary[1] /= total;
  } else {
    REF_INT i;
    printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e\n", __FILE__,
           __LINE__, __func__, total, bary[0], bary[1]);
    for (i = 0; i < 2; i++) bary[i] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}